

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

bool can_see(CHAR_DATA *ch,CHAR_DATA *victim)

{
  short sVar1;
  AREA_DATA_conflict *pAVar2;
  bool bVar3;
  int iVar4;
  AREA_AFFECT_DATA *pAVar5;
  AFFECT_DATA *paf_find;
  AFFECT_DATA *pAVar6;
  
  bVar3 = is_npc(ch);
  if (bVar3) {
    if (ch == victim) {
      return true;
    }
    if ((ch->act[0] & 0x20000000U) != 0) {
      return true;
    }
LAB_002a54b5:
    bVar3 = is_immortal(ch);
    if ((bVar3) || (bVar3 = is_affected_by(victim,0x1e), !bVar3)) {
      bVar3 = is_cabal_guard(ch);
      if ((bVar3) && (ch->desc == (DESCRIPTOR_DATA *)0x0)) goto LAB_002a55c7;
      iVar4 = get_trust(ch);
      if ((victim->invis_level <= iVar4) &&
         (((iVar4 = get_trust(ch), victim->incog_level <= iVar4 || (ch->in_room == victim->in_room))
          && ((iVar4 = get_trust(ch), iVar4 != 0x33 ||
              ((victim->invis_level != 0x33 || (bVar3 = is_heroimm(ch), bVar3)))))))) {
        bVar3 = is_npc(ch);
        if ((!bVar3) && ((ch->act[0] & 0x2000) != 0)) {
          return true;
        }
        bVar3 = is_npc(ch);
        if ((bVar3) && (bVar3 = is_immortal(ch), bVar3)) {
          return true;
        }
        bVar3 = is_npc(ch);
        if ((!bVar3) || (victim->invis_level < 0x33)) {
          bVar3 = is_npc(ch);
          if ((!bVar3) && (ch->pcdata->death_status == 8)) {
            return true;
          }
          bVar3 = is_cabal_guard(ch);
          if (bVar3) goto LAB_002a55c7;
          bVar3 = is_affected_by(ch,0);
          if (bVar3) {
            return false;
          }
          if (victim != (CHAR_DATA *)0x0) {
            pAVar6 = (AFFECT_DATA *)&victim->affected;
            while (pAVar6 = pAVar6->next, pAVar6 != (AFFECT_DATA *)0x0) {
              if (pAVar6->type == gsn_ultradiffusion) {
                return false;
              }
            }
          }
          pAVar2 = ch->in_room->area;
          if (pAVar2 != (AREA_DATA_conflict *)0x0) {
            pAVar5 = (AREA_AFFECT_DATA *)&pAVar2->affected;
            do {
              pAVar5 = pAVar5->next;
              if (pAVar5 == (AREA_AFFECT_DATA *)0x0) goto LAB_002a5676;
            } while (pAVar5->type != gsn_whiteout);
            bVar3 = is_outside(ch);
            if (bVar3) {
              pAVar5 = (AREA_AFFECT_DATA *)&ch->in_room->area->affected;
              do {
                pAVar5 = pAVar5->next;
                if (pAVar5 == (AREA_AFFECT_DATA *)0x0) break;
              } while (pAVar5->type != gsn_whiteout);
              if (pAVar5->owner != ch) goto LAB_002a559a;
            }
          }
LAB_002a5676:
          if (victim != (CHAR_DATA *)0x0) {
            pAVar6 = (AFFECT_DATA *)&victim->affected;
            do {
              pAVar6 = pAVar6->next;
              if (pAVar6 == (AFFECT_DATA *)0x0) goto LAB_002a56c6;
            } while (pAVar6->type != gsn_watermeld);
            if (ch == (CHAR_DATA *)0x0) goto LAB_002a559a;
            pAVar6 = (AFFECT_DATA *)&ch->affected;
            do {
              pAVar6 = pAVar6->next;
              if (pAVar6 == (AFFECT_DATA *)0x0) goto LAB_002a559a;
            } while (pAVar6->type != gsn_hydroperception);
          }
LAB_002a56c6:
          if (victim != (CHAR_DATA *)0x0) {
            pAVar6 = (AFFECT_DATA *)&victim->affected;
            while (pAVar6 = pAVar6->next, pAVar6 != (AFFECT_DATA *)0x0) {
              if (pAVar6->type == gsn_earthfade) {
                return false;
              }
            }
          }
          bVar3 = is_affected_by(victim,1);
          if ((!bVar3) || (bVar3 = is_affected_by(ch,3), bVar3)) {
LAB_002a5717:
            bVar3 = is_affected_by(victim,0x10);
            if (((!bVar3) || (bVar3 = is_affected_by(ch,5), bVar3)) ||
               (victim->fighting != (CHAR_DATA *)0x0)) {
LAB_002a5744:
              bVar3 = is_affected_by(victim,0xb);
              if (((!bVar3) || (bVar3 = is_affected_by(ch,8), bVar3)) &&
                 ((bVar3 = is_npc(ch), bVar3 ||
                  ((bVar3 = room_is_dark(ch->in_room), !bVar3 ||
                   (bVar3 = is_affected_by(ch,0x19), bVar3)))))) goto LAB_002a55c7;
            }
            else {
              if (ch != (CHAR_DATA *)0x0) {
                pAVar6 = (AFFECT_DATA *)&ch->affected;
                do {
                  pAVar6 = pAVar6->next;
                  if (pAVar6 == (AFFECT_DATA *)0x0) goto LAB_002a5942;
                } while (pAVar6->type != gsn_darksight);
                for (pAVar6 = ch->affected; pAVar6 != (AFFECT_DATA *)0x0; pAVar6 = pAVar6->next) {
                  if (pAVar6->type == gsn_darksight) goto LAB_002a5923;
                }
                pAVar6 = (AFFECT_DATA *)0x0;
LAB_002a5923:
                if (((pAVar6 != (AFFECT_DATA *)0x0) && (pAVar6->aftype == 1)) &&
                   (bVar3 = room_is_dark(victim->in_room), bVar3)) goto LAB_002a5744;
              }
LAB_002a5942:
              if (ch != (CHAR_DATA *)0x0) {
                pAVar6 = (AFFECT_DATA *)&ch->affected;
                do {
                  pAVar6 = pAVar6->next;
                  if (pAVar6 == (AFFECT_DATA *)0x0) goto LAB_002a59a5;
                } while (pAVar6->type != gsn_hydroperception);
                sVar1 = ch->in_room->sector_type;
                if (((sVar1 == 6) ||
                    ((sVar1 != 7 && ((sVar1 == 8 || (2 < victim->in_room->area->sky)))))) &&
                   (ch->in_room == victim->in_room)) goto LAB_002a5744;
              }
LAB_002a59a5:
              if (ch != (CHAR_DATA *)0x0) {
                pAVar6 = (AFFECT_DATA *)&ch->affected;
                do {
                  pAVar6 = pAVar6->next;
                  if (pAVar6 == (AFFECT_DATA *)0x0) goto LAB_002a559a;
                } while (pAVar6->type != gsn_sensevibrations);
                if (((((victim->in_room->sector_type & 0xfffeU) != 8) &&
                     ((ch->in_room->sector_type & 0xfffeU) != 8)) &&
                    (bVar3 = is_affected_by(victim,0xf), !bVar3)) &&
                   (bVar3 = is_affected_by(victim,0x13), !bVar3)) goto LAB_002a5744;
              }
            }
          }
          else {
            if (ch != (CHAR_DATA *)0x0) {
              pAVar6 = (AFFECT_DATA *)&ch->affected;
              do {
                pAVar6 = pAVar6->next;
                if (pAVar6 == (AFFECT_DATA *)0x0) goto LAB_002a580b;
              } while (pAVar6->type != gsn_hydroperception);
              sVar1 = ch->in_room->sector_type;
              if (((sVar1 == 6) ||
                  ((sVar1 != 7 && ((sVar1 == 8 || (2 < victim->in_room->area->sky)))))) &&
                 (ch->in_room == victim->in_room)) goto LAB_002a5717;
            }
LAB_002a580b:
            if (ch != (CHAR_DATA *)0x0) {
              pAVar6 = (AFFECT_DATA *)&ch->affected;
              do {
                pAVar6 = pAVar6->next;
                if (pAVar6 == (AFFECT_DATA *)0x0) goto LAB_002a5855;
              } while (pAVar6->type != gsn_sense_disturbance);
              if ((ch->in_room->sector_type != 8) && (victim->in_room->sector_type != 8))
              goto LAB_002a5717;
            }
LAB_002a5855:
            if (ch != (CHAR_DATA *)0x0) {
              pAVar6 = (AFFECT_DATA *)&ch->affected;
              do {
                pAVar6 = pAVar6->next;
                if (pAVar6 == (AFFECT_DATA *)0x0) goto LAB_002a559a;
              } while (pAVar6->type != gsn_sensevibrations);
              if (((((victim->in_room->sector_type & 0xfffeU) != 8) &&
                   ((ch->in_room->sector_type & 0xfffeU) != 8)) &&
                  (bVar3 = is_affected_by(victim,0xf), !bVar3)) &&
                 (bVar3 = is_affected_by(victim,0x13), !bVar3)) goto LAB_002a5717;
            }
          }
        }
      }
    }
LAB_002a559a:
    bVar3 = false;
  }
  else {
    if (ch != victim) goto LAB_002a54b5;
LAB_002a55c7:
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool can_see(CHAR_DATA *ch, CHAR_DATA *victim)
{
	AREA_AFFECT_DATA *paf;
	AFFECT_DATA *af;

	if (is_npc(ch) && IS_SET(ch->act, ACT_DETECT_SPECIAL))
		return true;

	if (ch == victim)
		return true;

	if (!is_immortal(ch) && is_affected_by(victim, AFF_NOSHOW))
		return false;

	if (is_cabal_guard(ch) && !ch->desc)
		return true;

	if (get_trust(ch) < victim->invis_level)
		return false;

	if (get_trust(ch) < victim->incog_level && ch->in_room != victim->in_room)
		return false;

	if (get_trust(ch) == LEVEL_HERO && victim->invis_level == LEVEL_HERO && !is_heroimm(ch))
		return false;

	if ((!is_npc(ch) && IS_SET(ch->act, PLR_HOLYLIGHT)) || (is_npc(ch) && is_immortal(ch)))
		return true;

	if (is_npc(ch) && victim->invis_level >= LEVEL_HERO)
		return false;

	if (!is_npc(ch) && ch->pcdata->death_status == HAS_DIED)
		return true;

	/* Make sure cabal guardians can always see */
	if (is_cabal_guard(ch))
		return true;

	if (is_affected_by(ch, AFF_BLIND))
		return false;

	if (is_affected(victim, gsn_ultradiffusion))
		return false;

	if (is_affected_area(ch->in_room->area, gsn_whiteout) && is_outside(ch))
	{
		for (paf = ch->in_room->area->affected; paf; paf = paf->next)
		{
			if (paf->type == gsn_whiteout)
				break;
		}

		if (paf->owner != ch)
			return false;
	}

	if (is_affected(victim, gsn_watermeld) && !is_affected(ch, gsn_hydroperception))
		return false;

	if (is_affected(victim, gsn_earthfade))
		return false;

	if (is_affected_by(victim, AFF_INVISIBLE)
		&& !is_affected_by(ch, AFF_DETECT_INVIS)
		&& (!(is_affected(ch, gsn_hydroperception)
			&& (ch->in_room->sector_type == SECT_WATER
				|| ch->in_room->sector_type == SECT_UNDERWATER
				|| (ch->in_room->sector_type != SECT_INSIDE && victim->in_room->area->sky >= WeatherCondition::Drizzle))
			&& ch->in_room == victim->in_room))
		&& !(is_affected(ch, gsn_sense_disturbance)
			&& ch->in_room->sector_type != SECT_UNDERWATER
			&& victim->in_room->sector_type != SECT_UNDERWATER)
		&& (!(is_affected(ch, gsn_sensevibrations)
			&& victim->in_room->sector_type != SECT_UNDERWATER
			&& victim->in_room->sector_type != SECT_AIR
			&& ch->in_room->sector_type != SECT_UNDERWATER
			&& ch->in_room->sector_type != SECT_AIR
			&& !is_affected_by(victim, AFF_SNEAK)
			&& !is_affected_by(victim, AFF_FLYING))))
	{
		return false;
	}

	if (is_affected_by(victim, AFF_HIDE)
		&& !is_affected_by(ch, AFF_DETECT_HIDDEN)
		&& victim->fighting == nullptr
		&& !(is_affected(ch, gsn_darksight)
			&& (af = affect_find(ch->affected, gsn_darksight))
			&& af->aftype == AFT_SKILL
			&& room_is_dark(victim->in_room))
		&& !(is_affected(ch, gsn_hydroperception)
			&& (ch->in_room->sector_type == SECT_WATER
				|| ch->in_room->sector_type == SECT_UNDERWATER
				|| (ch->in_room->sector_type != SECT_INSIDE && victim->in_room->area->sky >= WeatherCondition::Drizzle))
			&& ch->in_room == victim->in_room)
		&& !(is_affected(ch, gsn_sensevibrations)
			&& victim->in_room->sector_type != SECT_UNDERWATER
			&& victim->in_room->sector_type != SECT_AIR
			&& ch->in_room->sector_type != SECT_UNDERWATER
			&& ch->in_room->sector_type != SECT_AIR
			&& !is_affected_by(victim, AFF_SNEAK)
			&& !is_affected_by(victim, AFF_FLYING)))
	{
		return false;
	}

	if (is_affected_by(victim, AFF_CAMOUFLAGE) && !is_affected_by(ch, AFF_DETECT_CAMO))
		return false;

	if (is_npc(ch))
		return true;

	if (room_is_dark(ch->in_room) && !is_affected_by(ch, AFF_DARK_VISION))
		return false;

	return true;
}